

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::NegativeAPINoActiveProgram::Run(NegativeAPINoActiveProgram *this)

{
  bool bVar1;
  GLenum GVar2;
  GLuint GVar3;
  undefined8 local_a4;
  GLuint num_group_1 [3];
  GLuint buffer_1;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *glsl_fs;
  char *glsl_vs;
  GLuint num_group [3];
  GLuint buffer;
  NegativeAPINoActiveProgram *this_local;
  
  unique0x10000768 = this;
  glu::CallLogWrapper::glDispatchCompute
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,2,3);
  GVar2 = glu::CallLogWrapper::glGetError
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  if (GVar2 == 0x502) {
    glsl_vs = (char *)0x200000003;
    num_group[0] = 1;
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,num_group + 1);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90ee,num_group[1]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90ee,0xc,&glsl_vs,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    glu::CallLogWrapper::glDeleteBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,num_group + 1);
    GVar2 = glu::CallLogWrapper::glGetError
                      (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar2 == 0x502) {
      glsl_fs = 
      "\nlayout(location = 0) in vec4 g_position;\nvoid main() {\n  gl_Position = g_position;\n}";
      local_38 = "\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(1);\n}";
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,
                 "\nlayout(location = 0) in vec4 g_position;\nvoid main() {\n  gl_Position = g_position;\n}"
                 ,&local_59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer_1,
                 "\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(1);\n}",
                 (allocator<char> *)((long)num_group_1 + 0xb));
      GVar3 = ComputeShaderBase::CreateProgram
                        (&this->super_ComputeShaderBase,&local_58,(string *)&buffer_1);
      this->m_program = GVar3;
      std::__cxx11::string::~string((string *)&buffer_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)num_group_1 + 0xb));
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      bVar1 = ComputeShaderBase::CheckProgram
                        (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
      if (bVar1) {
        glu::CallLogWrapper::glUseProgram
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_program);
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,2,3);
        GVar2 = glu::CallLogWrapper::glGetError
                          (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper);
        if (GVar2 == 0x502) {
          local_a4 = 0x200000003;
          num_group_1[0] = 1;
          glu::CallLogWrapper::glGenBuffers
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1,num_group_1 + 1);
          glu::CallLogWrapper::glBindBuffer
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90ee,num_group_1[1]);
          glu::CallLogWrapper::glBufferData
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90ee,0xc,&local_a4,0x88e4);
          glu::CallLogWrapper::glDispatchComputeIndirect
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0);
          glu::CallLogWrapper::glDeleteBuffers
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1,num_group_1 + 1);
          GVar2 = glu::CallLogWrapper::glGetError
                            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                              super_CallLogWrapper);
          if (GVar2 == 0x502) {
            this_local = (NegativeAPINoActiveProgram *)0x0;
          }
          else {
            anon_unknown_0::Output
                      (
                      "INVALID_OPERATION is generated by DispatchCompute or\nDispatchComputeIndirect if there is no active program for the compute\nshader stage.\n"
                      );
            this_local = (NegativeAPINoActiveProgram *)&DAT_ffffffffffffffff;
          }
        }
        else {
          anon_unknown_0::Output
                    (
                    "INVALID_OPERATION is generated by DispatchCompute or\nDispatchComputeIndirect if there is no active program for the compute\nshader stage.\n"
                    );
          this_local = (NegativeAPINoActiveProgram *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (NegativeAPINoActiveProgram *)&DAT_ffffffffffffffff;
      }
    }
    else {
      anon_unknown_0::Output
                (
                "INVALID_OPERATION is generated by DispatchCompute or\nDispatchComputeIndirect if there is no active program for the compute\nshader stage.\n"
                );
      this_local = (NegativeAPINoActiveProgram *)&DAT_ffffffffffffffff;
    }
  }
  else {
    anon_unknown_0::Output
              (
              "INVALID_OPERATION is generated by DispatchCompute or\nDispatchComputeIndirect if there is no active program for the compute\nshader stage.\n"
              );
    this_local = (NegativeAPINoActiveProgram *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		glDispatchCompute(1, 2, 3);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION is generated by DispatchCompute or\n"
				   "DispatchComputeIndirect if there is no active program for the compute\n"
				   "shader stage.\n");
			return ERROR;
		}

		/* indirect dispatch */
		{
			GLuint		 buffer;
			const GLuint num_group[3] = { 3, 2, 1 };
			glGenBuffers(1, &buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_group), num_group, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
			glDeleteBuffers(1, &buffer);
			if (glGetError() != GL_INVALID_OPERATION)
			{
				Output("INVALID_OPERATION is generated by DispatchCompute or\n"
					   "DispatchComputeIndirect if there is no active program for the compute\n"
					   "shader stage.\n");
				return ERROR;
			}
		}

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "void main() {" NL "  gl_Position = g_position;" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_color;" NL "void main() {" NL "  g_color = vec4(1);" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glUseProgram(m_program);

		glDispatchCompute(1, 2, 3);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION is generated by DispatchCompute or\n"
				   "DispatchComputeIndirect if there is no active program for the compute\n"
				   "shader stage.\n");
			return ERROR;
		}

		/* indirect dispatch */
		{
			GLuint		 buffer;
			const GLuint num_group[3] = { 3, 2, 1 };
			glGenBuffers(1, &buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_group), num_group, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
			glDeleteBuffers(1, &buffer);
			if (glGetError() != GL_INVALID_OPERATION)
			{
				Output("INVALID_OPERATION is generated by DispatchCompute or\n"
					   "DispatchComputeIndirect if there is no active program for the compute\n"
					   "shader stage.\n");
				return ERROR;
			}
		}

		return NO_ERROR;
	}